

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O1

void api_suite::api_remove_back_n(void)

{
  size_type local_68;
  undefined4 local_5c;
  type local_58 [4];
  circular_view<int,_4UL> local_48;
  
  local_48.member.data = local_58;
  local_58[0] = 0xb;
  local_58[1] = 0xb;
  local_48.member.next = 6;
  local_48.member.size = 2;
  local_68 = 2;
  local_5c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x125,"void api_suite::api_remove_back_n()",&local_68,&local_5c);
  vista::circular_view<int,_4UL>::remove_back(&local_48,2);
  local_68 = local_48.member.size;
  local_5c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x127,"void api_suite::api_remove_back_n()",&local_68,&local_5c);
  return;
}

Assistant:

void api_remove_back_n()
{
    circular_array<int, 4> data;
    data.push_back(11);
    data.push_back(11);
    BOOST_TEST_EQ(data.size(), 2);
    data.remove_back(2);
    BOOST_TEST_EQ(data.size(), 0);
}